

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2_factory.hpp
# Opt level: O1

s2_grid_ptr __thiscall IntegratorXX::S2Factory::generate(S2Factory *this,AngularQuad aq,size_t npts)

{
  tuple<IntegratorXX::AhrensBeylkin<double>_*,_std::default_delete<IntegratorXX::AhrensBeylkin<double>_>_>
  tVar1;
  runtime_error *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_04;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_05;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_06;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  pointer *__ptr;
  s2_grid_ptr sVar3;
  __uniq_ptr_impl<IntegratorXX::AhrensBeylkin<double>,_std::default_delete<IntegratorXX::AhrensBeylkin<double>_>_>
  local_28;
  size_t local_20;
  
  local_20 = npts;
  switch(aq << 0x18 | aq - AhrensBeylkin >> 8) {
  case 0:
    tVar1.
    super__Tuple_impl<0UL,_IntegratorXX::AhrensBeylkin<double>_*,_std::default_delete<IntegratorXX::AhrensBeylkin<double>_>_>
    .super__Head_base<0UL,_IntegratorXX::AhrensBeylkin<double>_*,_false>._M_head_impl =
         (_Tuple_impl<0UL,_IntegratorXX::AhrensBeylkin<double>_*,_std::default_delete<IntegratorXX::AhrensBeylkin<double>_>_>
          )operator_new(0x30);
    Quadrature<IntegratorXX::AhrensBeylkin<double>>::Quadrature<unsigned_long&,void>
              ((Quadrature<IntegratorXX::AhrensBeylkin<double>> *)
               tVar1.
               super__Tuple_impl<0UL,_IntegratorXX::AhrensBeylkin<double>_*,_std::default_delete<IntegratorXX::AhrensBeylkin<double>_>_>
               .super__Head_base<0UL,_IntegratorXX::AhrensBeylkin<double>_*,_false>._M_head_impl,
               &local_20);
    local_28._M_t.
    super__Tuple_impl<0UL,_IntegratorXX::AhrensBeylkin<double>_*,_std::default_delete<IntegratorXX::AhrensBeylkin<double>_>_>
    .super__Head_base<0UL,_IntegratorXX::AhrensBeylkin<double>_*,_false>._M_head_impl =
         (tuple<IntegratorXX::AhrensBeylkin<double>_*,_std::default_delete<IntegratorXX::AhrensBeylkin<double>_>_>
          )(tuple<IntegratorXX::AhrensBeylkin<double>_*,_std::default_delete<IntegratorXX::AhrensBeylkin<double>_>_>
            )tVar1.
             super__Tuple_impl<0UL,_IntegratorXX::AhrensBeylkin<double>_*,_std::default_delete<IntegratorXX::AhrensBeylkin<double>_>_>
             .super__Head_base<0UL,_IntegratorXX::AhrensBeylkin<double>_*,_false>._M_head_impl;
    std::
    __shared_ptr<IntegratorXX::QuadratureBase<std::vector<std::array<double,3ul>,std::allocator<std::array<double,3ul>>>,std::vector<double,std::allocator<double>>>,(__gnu_cxx::_Lock_policy)2>
    ::
    __shared_ptr<IntegratorXX::AhrensBeylkin<double>,std::default_delete<IntegratorXX::AhrensBeylkin<double>>,void>
              ((__shared_ptr<IntegratorXX::QuadratureBase<std::vector<std::array<double,3ul>,std::allocator<std::array<double,3ul>>>,std::vector<double,std::allocator<double>>>,(__gnu_cxx::_Lock_policy)2>
                *)this,(unique_ptr<IntegratorXX::AhrensBeylkin<double>,_std::default_delete<IntegratorXX::AhrensBeylkin<double>_>_>
                        *)&local_28);
    _Var2._M_pi = extraout_RDX;
    if ((_Tuple_impl<0UL,_IntegratorXX::AhrensBeylkin<double>_*,_std::default_delete<IntegratorXX::AhrensBeylkin<double>_>_>
         )local_28._M_t.
          super__Tuple_impl<0UL,_IntegratorXX::AhrensBeylkin<double>_*,_std::default_delete<IntegratorXX::AhrensBeylkin<double>_>_>
          .super__Head_base<0UL,_IntegratorXX::AhrensBeylkin<double>_*,_false>._M_head_impl !=
        (AhrensBeylkin<double> *)0x0) {
      std::default_delete<IntegratorXX::AhrensBeylkin<double>_>::operator()
                ((default_delete<IntegratorXX::AhrensBeylkin<double>_> *)&local_28,
                 (AhrensBeylkin<double> *)
                 local_28._M_t.
                 super__Tuple_impl<0UL,_IntegratorXX::AhrensBeylkin<double>_*,_std::default_delete<IntegratorXX::AhrensBeylkin<double>_>_>
                 .super__Head_base<0UL,_IntegratorXX::AhrensBeylkin<double>_*,_false>._M_head_impl);
      _Var2._M_pi = extraout_RDX_00;
    }
    break;
  case 1:
    tVar1.
    super__Tuple_impl<0UL,_IntegratorXX::AhrensBeylkin<double>_*,_std::default_delete<IntegratorXX::AhrensBeylkin<double>_>_>
    .super__Head_base<0UL,_IntegratorXX::AhrensBeylkin<double>_*,_false>._M_head_impl =
         (_Tuple_impl<0UL,_IntegratorXX::AhrensBeylkin<double>_*,_std::default_delete<IntegratorXX::AhrensBeylkin<double>_>_>
          )operator_new(0x30);
    Quadrature<IntegratorXX::Delley<double>>::Quadrature<unsigned_long&,void>
              ((Quadrature<IntegratorXX::Delley<double>> *)
               tVar1.
               super__Tuple_impl<0UL,_IntegratorXX::AhrensBeylkin<double>_*,_std::default_delete<IntegratorXX::AhrensBeylkin<double>_>_>
               .super__Head_base<0UL,_IntegratorXX::AhrensBeylkin<double>_*,_false>._M_head_impl,
               &local_20);
    local_28._M_t.
    super__Tuple_impl<0UL,_IntegratorXX::AhrensBeylkin<double>_*,_std::default_delete<IntegratorXX::AhrensBeylkin<double>_>_>
    .super__Head_base<0UL,_IntegratorXX::AhrensBeylkin<double>_*,_false>._M_head_impl =
         (tuple<IntegratorXX::AhrensBeylkin<double>_*,_std::default_delete<IntegratorXX::AhrensBeylkin<double>_>_>
          )(tuple<IntegratorXX::AhrensBeylkin<double>_*,_std::default_delete<IntegratorXX::AhrensBeylkin<double>_>_>
            )tVar1.
             super__Tuple_impl<0UL,_IntegratorXX::AhrensBeylkin<double>_*,_std::default_delete<IntegratorXX::AhrensBeylkin<double>_>_>
             .super__Head_base<0UL,_IntegratorXX::AhrensBeylkin<double>_*,_false>._M_head_impl;
    std::
    __shared_ptr<IntegratorXX::QuadratureBase<std::vector<std::array<double,3ul>,std::allocator<std::array<double,3ul>>>,std::vector<double,std::allocator<double>>>,(__gnu_cxx::_Lock_policy)2>
    ::
    __shared_ptr<IntegratorXX::Delley<double>,std::default_delete<IntegratorXX::Delley<double>>,void>
              ((__shared_ptr<IntegratorXX::QuadratureBase<std::vector<std::array<double,3ul>,std::allocator<std::array<double,3ul>>>,std::vector<double,std::allocator<double>>>,(__gnu_cxx::_Lock_policy)2>
                *)this,(unique_ptr<IntegratorXX::Delley<double>,_std::default_delete<IntegratorXX::Delley<double>_>_>
                        *)&local_28);
    _Var2._M_pi = extraout_RDX_05;
    if ((_Tuple_impl<0UL,_IntegratorXX::AhrensBeylkin<double>_*,_std::default_delete<IntegratorXX::AhrensBeylkin<double>_>_>
         )local_28._M_t.
          super__Tuple_impl<0UL,_IntegratorXX::AhrensBeylkin<double>_*,_std::default_delete<IntegratorXX::AhrensBeylkin<double>_>_>
          .super__Head_base<0UL,_IntegratorXX::AhrensBeylkin<double>_*,_false>._M_head_impl !=
        (AhrensBeylkin<double> *)0x0) {
      std::default_delete<IntegratorXX::Delley<double>_>::operator()
                ((default_delete<IntegratorXX::Delley<double>_> *)&local_28,
                 (Delley<double> *)
                 local_28._M_t.
                 super__Tuple_impl<0UL,_IntegratorXX::AhrensBeylkin<double>_*,_std::default_delete<IntegratorXX::AhrensBeylkin<double>_>_>
                 .super__Head_base<0UL,_IntegratorXX::AhrensBeylkin<double>_*,_false>._M_head_impl);
      _Var2._M_pi = extraout_RDX_06;
    }
    break;
  case 2:
    tVar1.
    super__Tuple_impl<0UL,_IntegratorXX::AhrensBeylkin<double>_*,_std::default_delete<IntegratorXX::AhrensBeylkin<double>_>_>
    .super__Head_base<0UL,_IntegratorXX::AhrensBeylkin<double>_*,_false>._M_head_impl =
         (_Tuple_impl<0UL,_IntegratorXX::AhrensBeylkin<double>_*,_std::default_delete<IntegratorXX::AhrensBeylkin<double>_>_>
          )operator_new(0x30);
    Quadrature<IntegratorXX::LebedevLaikov<double>>::Quadrature<unsigned_long&,void>
              ((Quadrature<IntegratorXX::LebedevLaikov<double>> *)
               tVar1.
               super__Tuple_impl<0UL,_IntegratorXX::AhrensBeylkin<double>_*,_std::default_delete<IntegratorXX::AhrensBeylkin<double>_>_>
               .super__Head_base<0UL,_IntegratorXX::AhrensBeylkin<double>_*,_false>._M_head_impl,
               &local_20);
    local_28._M_t.
    super__Tuple_impl<0UL,_IntegratorXX::AhrensBeylkin<double>_*,_std::default_delete<IntegratorXX::AhrensBeylkin<double>_>_>
    .super__Head_base<0UL,_IntegratorXX::AhrensBeylkin<double>_*,_false>._M_head_impl =
         (tuple<IntegratorXX::AhrensBeylkin<double>_*,_std::default_delete<IntegratorXX::AhrensBeylkin<double>_>_>
          )(tuple<IntegratorXX::AhrensBeylkin<double>_*,_std::default_delete<IntegratorXX::AhrensBeylkin<double>_>_>
            )tVar1.
             super__Tuple_impl<0UL,_IntegratorXX::AhrensBeylkin<double>_*,_std::default_delete<IntegratorXX::AhrensBeylkin<double>_>_>
             .super__Head_base<0UL,_IntegratorXX::AhrensBeylkin<double>_*,_false>._M_head_impl;
    std::
    __shared_ptr<IntegratorXX::QuadratureBase<std::vector<std::array<double,3ul>,std::allocator<std::array<double,3ul>>>,std::vector<double,std::allocator<double>>>,(__gnu_cxx::_Lock_policy)2>
    ::
    __shared_ptr<IntegratorXX::LebedevLaikov<double>,std::default_delete<IntegratorXX::LebedevLaikov<double>>,void>
              ((__shared_ptr<IntegratorXX::QuadratureBase<std::vector<std::array<double,3ul>,std::allocator<std::array<double,3ul>>>,std::vector<double,std::allocator<double>>>,(__gnu_cxx::_Lock_policy)2>
                *)this,(unique_ptr<IntegratorXX::LebedevLaikov<double>,_std::default_delete<IntegratorXX::LebedevLaikov<double>_>_>
                        *)&local_28);
    _Var2._M_pi = extraout_RDX_01;
    if ((_Tuple_impl<0UL,_IntegratorXX::AhrensBeylkin<double>_*,_std::default_delete<IntegratorXX::AhrensBeylkin<double>_>_>
         )local_28._M_t.
          super__Tuple_impl<0UL,_IntegratorXX::AhrensBeylkin<double>_*,_std::default_delete<IntegratorXX::AhrensBeylkin<double>_>_>
          .super__Head_base<0UL,_IntegratorXX::AhrensBeylkin<double>_*,_false>._M_head_impl !=
        (AhrensBeylkin<double> *)0x0) {
      std::default_delete<IntegratorXX::LebedevLaikov<double>_>::operator()
                ((default_delete<IntegratorXX::LebedevLaikov<double>_> *)&local_28,
                 (LebedevLaikov<double> *)
                 local_28._M_t.
                 super__Tuple_impl<0UL,_IntegratorXX::AhrensBeylkin<double>_*,_std::default_delete<IntegratorXX::AhrensBeylkin<double>_>_>
                 .super__Head_base<0UL,_IntegratorXX::AhrensBeylkin<double>_*,_false>._M_head_impl);
      _Var2._M_pi = extraout_RDX_02;
    }
    break;
  case 3:
    tVar1.
    super__Tuple_impl<0UL,_IntegratorXX::AhrensBeylkin<double>_*,_std::default_delete<IntegratorXX::AhrensBeylkin<double>_>_>
    .super__Head_base<0UL,_IntegratorXX::AhrensBeylkin<double>_*,_false>._M_head_impl =
         (_Tuple_impl<0UL,_IntegratorXX::AhrensBeylkin<double>_*,_std::default_delete<IntegratorXX::AhrensBeylkin<double>_>_>
          )operator_new(0x30);
    Quadrature<IntegratorXX::Womersley<double>>::Quadrature<unsigned_long&,void>
              ((Quadrature<IntegratorXX::Womersley<double>> *)
               tVar1.
               super__Tuple_impl<0UL,_IntegratorXX::AhrensBeylkin<double>_*,_std::default_delete<IntegratorXX::AhrensBeylkin<double>_>_>
               .super__Head_base<0UL,_IntegratorXX::AhrensBeylkin<double>_*,_false>._M_head_impl,
               &local_20);
    local_28._M_t.
    super__Tuple_impl<0UL,_IntegratorXX::AhrensBeylkin<double>_*,_std::default_delete<IntegratorXX::AhrensBeylkin<double>_>_>
    .super__Head_base<0UL,_IntegratorXX::AhrensBeylkin<double>_*,_false>._M_head_impl =
         (tuple<IntegratorXX::AhrensBeylkin<double>_*,_std::default_delete<IntegratorXX::AhrensBeylkin<double>_>_>
          )(tuple<IntegratorXX::AhrensBeylkin<double>_*,_std::default_delete<IntegratorXX::AhrensBeylkin<double>_>_>
            )tVar1.
             super__Tuple_impl<0UL,_IntegratorXX::AhrensBeylkin<double>_*,_std::default_delete<IntegratorXX::AhrensBeylkin<double>_>_>
             .super__Head_base<0UL,_IntegratorXX::AhrensBeylkin<double>_*,_false>._M_head_impl;
    std::
    __shared_ptr<IntegratorXX::QuadratureBase<std::vector<std::array<double,3ul>,std::allocator<std::array<double,3ul>>>,std::vector<double,std::allocator<double>>>,(__gnu_cxx::_Lock_policy)2>
    ::
    __shared_ptr<IntegratorXX::Womersley<double>,std::default_delete<IntegratorXX::Womersley<double>>,void>
              ((__shared_ptr<IntegratorXX::QuadratureBase<std::vector<std::array<double,3ul>,std::allocator<std::array<double,3ul>>>,std::vector<double,std::allocator<double>>>,(__gnu_cxx::_Lock_policy)2>
                *)this,(unique_ptr<IntegratorXX::Womersley<double>,_std::default_delete<IntegratorXX::Womersley<double>_>_>
                        *)&local_28);
    _Var2._M_pi = extraout_RDX_03;
    if ((_Tuple_impl<0UL,_IntegratorXX::AhrensBeylkin<double>_*,_std::default_delete<IntegratorXX::AhrensBeylkin<double>_>_>
         )local_28._M_t.
          super__Tuple_impl<0UL,_IntegratorXX::AhrensBeylkin<double>_*,_std::default_delete<IntegratorXX::AhrensBeylkin<double>_>_>
          .super__Head_base<0UL,_IntegratorXX::AhrensBeylkin<double>_*,_false>._M_head_impl !=
        (AhrensBeylkin<double> *)0x0) {
      std::default_delete<IntegratorXX::Womersley<double>_>::operator()
                ((default_delete<IntegratorXX::Womersley<double>_> *)&local_28,
                 (Womersley<double> *)
                 local_28._M_t.
                 super__Tuple_impl<0UL,_IntegratorXX::AhrensBeylkin<double>_*,_std::default_delete<IntegratorXX::AhrensBeylkin<double>_>_>
                 .super__Head_base<0UL,_IntegratorXX::AhrensBeylkin<double>_*,_false>._M_head_impl);
      _Var2._M_pi = extraout_RDX_04;
    }
    break;
  default:
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"Unsupported Angular Quadrature");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  sVar3.
  super___shared_ptr<IntegratorXX::QuadratureBase<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>,_std::vector<double,_std::allocator<double>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = _Var2._M_pi;
  sVar3.
  super___shared_ptr<IntegratorXX::QuadratureBase<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>,_std::vector<double,_std::allocator<double>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)this;
  return (s2_grid_ptr)
         sVar3.
         super___shared_ptr<IntegratorXX::QuadratureBase<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>,_std::vector<double,_std::allocator<double>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

S2Factory::s2_grid_ptr S2Factory::generate(AngularQuad aq, size_t npts) {

  switch(aq) {
    case AngularQuad::AhrensBeylkin:
      return std::make_unique<ah_type>(npts);
    case AngularQuad::Delley:
      return std::make_unique<de_type>(npts);
    case AngularQuad::LebedevLaikov:
      return std::make_unique<ll_type>(npts);
    case AngularQuad::Womersley:
      return std::make_unique<wo_type>(npts);
    default:
      throw std::runtime_error("Unsupported Angular Quadrature");
      abort();
  } 
}